

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O2

void cscPrintDense(char *s,CUPDLPcsc *csc)

{
  cupdlp_int *pcVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  bool bVar5;
  
  puts("------------------------------------------------");
  printf("%s (Trans):\n",s);
  lVar2 = 0;
  while (lVar2 < csc->nCols) {
    pcVar1 = csc->colMatBeg;
    for (lVar3 = (long)pcVar1[lVar2]; lVar3 < pcVar1[lVar2 + 1]; lVar3 = lVar3 + 1) {
      iVar4 = csc->colMatIdx[lVar3];
      if (pcVar1[lVar2] != (int)lVar3) {
        iVar4 = iVar4 + ~csc->colMatIdx[lVar3 + -1];
      }
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
        printf("       ");
      }
      printf("%6.3f ",csc->colMatElem[lVar3]);
      pcVar1 = csc->colMatBeg;
    }
    putchar(10);
    lVar2 = lVar2 + 1;
  }
  puts("------------------------------------------------");
  return;
}

Assistant:

void cscPrintDense(const char *s, CUPDLPcsc *csc) {
  cupdlp_printf("------------------------------------------------\n");
  cupdlp_printf("%s (Trans):\n", s);
  cupdlp_int deltaRow = 0;
  for (cupdlp_int iCol = 0; iCol < csc->nCols; ++iCol) {
    for (cupdlp_int iElem = csc->colMatBeg[iCol];
         iElem < csc->colMatBeg[iCol + 1]; ++iElem) {
      if (iElem == csc->colMatBeg[iCol])
        deltaRow = csc->colMatIdx[iElem];
      else
        deltaRow = csc->colMatIdx[iElem] - csc->colMatIdx[iElem - 1] - 1;
      for (cupdlp_int i = 0; i < deltaRow; ++i) {
        cupdlp_printf("       ");
      }
      cupdlp_printf("%6.3f ", csc->colMatElem[iElem]);
    }
    cupdlp_printf("\n");
  }
  cupdlp_printf("------------------------------------------------\n");
}